

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Cluster::Parse(Cluster *this,longlong *pos,long *len)

{
  IMkvReader *pReader;
  int iVar1;
  long lVar2;
  long *plVar3;
  longlong lVar4;
  ulong block_size;
  long lVar5;
  long lVar6;
  longlong avail;
  longlong total;
  long local_48;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  lVar2 = Load(this,pos,len);
  if (lVar2 < 0) {
    return lVar2;
  }
  if (this->m_pos < this->m_element_start) {
    return -1;
  }
  if (this->m_timecode < 0) {
    return -1;
  }
  lVar2 = -1;
  if (-1 < this->m_element_size) {
    lVar2 = this->m_element_start + this->m_element_size;
  }
  if (lVar2 <= this->m_pos && -1 < lVar2) {
    return 1;
  }
  pReader = this->m_pSegment->m_pReader;
  iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_40,&local_48);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  if ((-1 < local_40) && (local_40 < local_48)) {
    return -2;
  }
  lVar5 = this->m_pos;
  *pos = lVar5;
  if (lVar2 < 0 || lVar5 < lVar2) {
    do {
      if ((-1 < local_40) && (local_40 <= lVar5)) {
        lVar6 = this->m_element_size;
        if (lVar6 < 0) {
          lVar6 = lVar5 - this->m_element_start;
          this->m_element_size = lVar6;
        }
        goto LAB_001112c6;
      }
      if (local_48 <= lVar5) {
LAB_001114f1:
        *len = 1;
        return -3;
      }
      lVar4 = GetUIntLength(pReader,lVar5,len);
      if (lVar4 < 0) {
        return lVar4;
      }
      if (lVar4 != 0) {
        return -3;
      }
      lVar5 = *len + *pos;
      if (-1 < lVar2 && lVar2 < lVar5) {
        return -2;
      }
      if (local_48 < lVar5) {
        return -3;
      }
      lVar4 = ReadID(pReader,*pos,len);
      if (lVar4 < 0) {
        return -2;
      }
      if ((lVar4 == 0x1f43b675) || (lVar4 == 0x1c53bb6b)) {
        if (this->m_element_size < 0) {
          this->m_element_size = *pos - this->m_element_start;
        }
        break;
      }
      lVar5 = *pos + *len;
      *pos = lVar5;
      if (local_48 <= lVar5) goto LAB_001114f1;
      local_38 = lVar4;
      lVar4 = GetUIntLength(pReader,lVar5,len);
      if (lVar4 < 0) {
        return lVar4;
      }
      if (lVar4 != 0) {
        return -3;
      }
      lVar5 = *len + *pos;
      if (-1 < lVar2 && lVar2 < lVar5) {
        return -2;
      }
      if (local_48 < lVar5) {
        return -3;
      }
      block_size = ReadUInt(pReader,*pos,len);
      if ((long)block_size < 0) {
        return block_size;
      }
      if ((-1L << ((char)*len * '\a' & 0x3fU) ^ block_size) == 0xffffffffffffffff) {
        return -2;
      }
      lVar5 = *len + *pos;
      *pos = lVar5;
      if (-1 < lVar2 && lVar2 < lVar5) {
        return -2;
      }
      if (block_size != 0) {
        lVar5 = lVar5 + block_size;
        if (lVar2 < 0) {
          if ((-1 < local_40) && (local_40 < lVar5)) {
            this->m_element_size = local_40 - this->m_element_start;
            *pos = local_40;
            break;
          }
          if (local_48 < lVar5) {
            *len = block_size;
            return -3;
          }
        }
        else if (lVar2 < lVar5) {
          if (local_38 == 0xa0) {
            return -2;
          }
          if (local_38 == 0xa3) {
            return -2;
          }
          *pos = lVar2;
          break;
        }
        if (local_38 == 0xa3) {
          lVar2 = ParseSimpleBlock(this,block_size,pos,len);
          return lVar2;
        }
        if (local_38 == 0xa0) {
          lVar2 = ParseBlockGroup(this,block_size,pos,len);
          return lVar2;
        }
        *pos = lVar5;
        if ((-1 < lVar2) && (lVar2 < lVar5)) {
          return -2;
        }
      }
    } while ((lVar2 < 0) || (lVar5 < lVar2));
  }
  lVar6 = this->m_element_size;
LAB_001112c6:
  if (lVar6 < 1) {
    return -2;
  }
  lVar5 = *pos;
  this->m_pos = lVar5;
  if (-1 < lVar2 && lVar2 < lVar5) {
    return -2;
  }
  if (this->m_entries_count < 1) {
LAB_0011155c:
    lVar2 = 1;
  }
  else {
    if (this->m_entries[this->m_entries_count + -1] != (BlockEntry *)0x0) {
      iVar1 = (*this->m_entries[this->m_entries_count + -1]->_vptr_BlockEntry[2])();
      plVar3 = (long *)CONCAT44(extraout_var,iVar1);
      if ((plVar3 != (long *)0x0) && ((local_40 < 0 || (*plVar3 <= local_40)))) {
        lVar5 = *plVar3 + plVar3[1];
        if ((-1 < lVar2) && (lVar2 < lVar5)) {
          return -2;
        }
        if ((-1 < local_40) && (local_40 < lVar5)) {
          return -1;
        }
        goto LAB_0011155c;
      }
    }
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

long Cluster::Parse(long long& pos, long& len) const {
  long status = Load(pos, len);

  if (status < 0)
    return status;

  if (m_pos < m_element_start || m_timecode < 0)
    return E_PARSE_FAILED;

  const long long cluster_stop =
      (m_element_size < 0) ? -1 : m_element_start + m_element_size;

  if ((cluster_stop >= 0) && (m_pos >= cluster_stop))
    return 1;  // nothing else to do

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    if ((total >= 0) && (pos >= total)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if ((id == libwebm::kMkvCluster) || (id == libwebm::kMkvCues)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    // const long long block_start = pos;
    const long long block_stop = pos + size;

    if (cluster_stop >= 0) {
      if (block_stop > cluster_stop) {
        if (id == libwebm::kMkvBlockGroup || id == libwebm::kMkvSimpleBlock) {
          return E_FILE_FORMAT_INVALID;
        }

        pos = cluster_stop;
        break;
      }
    } else if ((total >= 0) && (block_stop > total)) {
      m_element_size = total - m_element_start;
      pos = total;
      break;
    } else if (block_stop > avail) {
      len = static_cast<long>(size);
      return E_BUFFER_NOT_FULL;
    }

    Cluster* const this_ = const_cast<Cluster*>(this);

    if (id == libwebm::kMkvBlockGroup)
      return this_->ParseBlockGroup(size, pos, len);

    if (id == libwebm::kMkvSimpleBlock)
      return this_->ParseSimpleBlock(size, pos, len);

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (m_element_size < 1)
    return E_FILE_FORMAT_INVALID;

  m_pos = pos;
  if (cluster_stop >= 0 && m_pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_entries_count > 0) {
    const long idx = m_entries_count - 1;

    const BlockEntry* const pLast = m_entries[idx];
    if (pLast == NULL)
      return E_PARSE_FAILED;

    const Block* const pBlock = pLast->GetBlock();
    if (pBlock == NULL)
      return E_PARSE_FAILED;

    const long long start = pBlock->m_start;

    if ((total >= 0) && (start > total))
      return E_PARSE_FAILED;  // defend against trucated stream

    const long long size = pBlock->m_size;

    const long long stop = start + size;
    if (cluster_stop >= 0 && stop > cluster_stop)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && (stop > total))
      return E_PARSE_FAILED;  // defend against trucated stream
  }

  return 1;  // no more entries
}